

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RadiusDamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  VMValue *pVVar4;
  AActor *pAVar5;
  VMValue *pVVar6;
  AActor *this;
  uint uVar7;
  char *pcVar8;
  int damage;
  PClassActor *type;
  bool bVar9;
  double dVar10;
  double dVar11;
  FName local_54;
  DAngle local_50;
  DVector3 local_48;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003cb117;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cb0e8:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cb117:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x558,
                  "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003cae79;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cb117;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003cb0e8;
LAB_003cae79:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar4 = defaultparam->Array;
    if (pVVar4[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb167:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x559,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = pVVar4[1].field_0.i;
LAB_003caec9:
    if (pVVar4[2].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cb186:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55a,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar10 = pVVar4[2].field_0.f;
LAB_003caed8:
    if (pVVar4[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb136:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55b,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar7 = pVVar4[3].field_0.i;
LAB_003caee6:
    if (pVVar4[4].field_0.field_3.Type != '\x03') {
LAB_003cb0f1:
      pcVar8 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003cb0f8:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55c,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar6 = pVVar4 + 4;
    if (pVVar4[4].field_0.field_1.atag == 1) goto LAB_003caefa;
    if ((pVVar6->field_0).field_1.a != (void *)0x0) goto LAB_003cb0f1;
LAB_003caf09:
    type = (PClassActor *)0x0;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cb167;
    }
    iVar2 = param[1].field_0.i;
    if (numparam < 3) {
      pVVar4 = defaultparam->Array;
      goto LAB_003caec9;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cb186;
    }
    dVar10 = param[2].field_0.f;
    if (numparam == 3) {
      pVVar4 = defaultparam->Array;
      goto LAB_003caed8;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cb136;
    }
    uVar7 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      pVVar4 = defaultparam->Array;
      goto LAB_003caee6;
    }
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003cb0d7:
      pcVar8 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003cb0f8;
    }
    pVVar6 = param + 4;
    if (param[4].field_0.field_1.atag != 1) {
      if ((pVVar6->field_0).field_1.a != (void *)0x0) goto LAB_003cb0d7;
      goto LAB_003caf09;
    }
LAB_003caefa:
    type = (PClassActor *)(pVVar6->field_0).field_1.a;
  }
  pAVar5 = (this->target).field_0.p;
  if (pAVar5 == (AActor *)0x0) {
LAB_003caf2f:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_003caf2f;
  }
  dVar11 = AActor::Distance3D(this,pAVar5,false);
  if (dVar10 <= dVar11) {
    return 0;
  }
  iVar2 = iVar2 - (int)((dVar11 * (double)iVar2) / dVar10);
  damage = iVar2;
  if (((uVar7 & 1) != 0) && (damage = 0, 0 < iVar2)) {
    do {
      uVar7 = FRandom::GenRand32(&pr_bfgselfdamage);
      damage = damage + (uVar7 & 7) + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  iVar2 = 200;
  if (type == (PClassActor *)0x0) {
    uVar7 = 0;
  }
  else {
    pAVar5 = (this->target).field_0.p;
    local_48.Z = pAVar5->Height * 0.25 + (pAVar5->__Pos).Z;
    local_48.X = (pAVar5->__Pos).X;
    local_48.Y = (pAVar5->__Pos).Y;
    uVar7 = 0;
    pAVar5 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->flags5).Value & 0x800000) != 0) {
        (pAVar5->target).field_0 = (this->target).field_0;
      }
      uVar7 = (pAVar5->flags7).Value & 0x80 | (pAVar5->flags3).Value >> 0x13 & 0x40;
      iVar2 = (pAVar5->DamageType).super_FName.Index;
    }
  }
  pAVar5 = (this->target).field_0.p;
  if (pAVar5 == (AActor *)0x0) {
LAB_003cb037:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_003cb037;
  }
  local_50.Degrees = 0.0;
  local_54.Index = iVar2;
  iVar2 = P_DamageMobj(pAVar5,this,pAVar5,damage,&local_54,uVar7,&local_50);
  if (0 < iVar2) {
    damage = iVar2;
  }
  pAVar5 = (this->target).field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003cb087;
    (this->target).field_0.p = (AActor *)0x0;
  }
  pAVar5 = (AActor *)0x0;
LAB_003cb087:
  P_TraceBleed(damage,pAVar5,this);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusDamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(damage);
	PARAM_FLOAT_DEF(distance);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(flashtype, AActor);

	int 				i;
	int 				damageSteps;
	int 				actualDamage;
	double 				actualDistance;

	actualDistance = self->Distance3D(self->target);
	if (actualDistance < distance)
	{
		// [XA] Decrease damage with distance. Use the BFG damage
		//      calculation formula if the flag is set (essentially
		//      a generalization of SMMU's BFG11K behavior, used
		//      with fraggle's blessing.)
		damageSteps = damage - int(damage * actualDistance / distance);
		if (flags & RDSF_BFGDAMAGE)
		{
			actualDamage = 0;
			for (i = 0; i < damageSteps; ++i)
				actualDamage += (pr_bfgselfdamage() & 7) + 1;
		}
		else
		{
			actualDamage = damageSteps;
		}

		// optional "flash" effect -- spawn an actor on
		// the player to indicate bad things happened.
		AActor *flash = NULL;
		if(flashtype != NULL)
			flash = Spawn(flashtype, self->target->PosPlusZ(self->target->Height / 4), ALLOW_REPLACE);

		int dmgFlags = 0;
		FName dmgType = NAME_BFGSplash;

		if (flash != NULL)
		{
			if (flash->flags5 & MF5_PUFFGETSOWNER) flash->target = self->target;
			if (flash->flags3 & MF3_FOILINVUL) dmgFlags |= DMG_FOILINVUL;
			if (flash->flags7 & MF7_FOILBUDDHA) dmgFlags |= DMG_FOILBUDDHA;
			dmgType = flash->DamageType;
		}

		int newdam = P_DamageMobj(self->target, self, self->target, actualDamage, dmgType, dmgFlags);
		P_TraceBleed(newdam > 0 ? newdam : actualDamage, self->target, self);
	}

	return 0;
}